

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaopen_base(lua_State *L)

{
  lua_State *L_local;
  
  base_open(L);
  return 1;
}

Assistant:

static int luaopen_base(lua_State*L){
base_open(L);
return 1;
}